

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_proxy.c
# Opt level: O3

int Curl_connect_getsock(connectdata *conn)

{
  int iVar1;
  
  iVar1 = 1;
  if ((conn->connect_state->http_proxy).sending == HTTPSEND_REQUEST) {
    iVar1 = 0x10000;
  }
  return iVar1;
}

Assistant:

int Curl_connect_getsock(struct connectdata *conn)
{
  struct HTTP *http;
  DEBUGASSERT(conn);
  DEBUGASSERT(conn->connect_state);
  http = &conn->connect_state->http_proxy;

  if(http->sending == HTTPSEND_REQUEST)
    return GETSOCK_WRITESOCK(0);

  return GETSOCK_READSOCK(0);
}